

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

RAMBlock *
qemu_ram_block_from_host_aarch64
          (uc_struct_conflict2 *uc,void *ptr,_Bool round_offset,ram_addr_t *offset)

{
  uint8_t *host;
  RAMBlock *block;
  ram_addr_t *offset_local;
  _Bool round_offset_local;
  void *ptr_local;
  uc_struct_conflict2 *uc_local;
  
  host = (uint8_t *)(uc->ram_list).mru_block;
  if ((((RAMBlock *)host == (RAMBlock *)0x0) || (((RAMBlock *)host)->host == (uint8_t *)0x0)) ||
     (((RAMBlock *)host)->max_length <= (ulong)((long)ptr - (long)((RAMBlock *)host)->host))) {
    for (host = (uint8_t *)(uc->ram_list).blocks.lh_first; host != (uint8_t *)0x0;
        host = *(uint8_t **)(host + 0x30)) {
      if ((*(long *)(host + 8) != 0) &&
         ((ulong)((long)ptr - *(long *)(host + 8)) < *(ulong *)(host + 0x20))) goto LAB_00690a03;
    }
    uc_local = (uc_struct_conflict2 *)0x0;
  }
  else {
LAB_00690a03:
    *offset = (long)ptr - *(long *)(host + 8);
    if (round_offset) {
      *offset = uc->init_target_page->mask & *offset;
    }
    uc_local = (uc_struct_conflict2 *)host;
  }
  return (RAMBlock *)uc_local;
}

Assistant:

RAMBlock *qemu_ram_block_from_host(struct uc_struct *uc, void *ptr,
                                   bool round_offset, ram_addr_t *offset)
{
    RAMBlock *block;
    uint8_t *host = ptr;

    block = uc->ram_list.mru_block;
    if (block && block->host && host - block->host < block->max_length) {
        goto found;
    }

    RAMBLOCK_FOREACH(block) {
        /* This case append when the block is not mapped. */
        if (block->host == NULL) {
            continue;
        }
        if (host - block->host < block->max_length) {
            goto found;
        }
    }

    return NULL;

found:
    *offset = (host - block->host);
    if (round_offset) {
        *offset &= TARGET_PAGE_MASK;
    }
    return block;
}